

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::Mesh::owned_array<signed_char>(Mesh *this,Int ent_dim,Read<signed_char> *a,Int width)

{
  Alloc *pAVar1;
  bool bVar2;
  LO LVar3;
  undefined4 in_register_0000000c;
  Write<signed_char> *pWVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  undefined4 in_register_00000034;
  int in_R8D;
  int iVar6;
  Read<signed_char> RVar7;
  LOs o2e;
  Read<signed_char> o;
  Write<signed_char> local_90;
  Write<int> local_80;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<int> local_50;
  
  pWVar4 = (Write<signed_char> *)CONCAT44(in_register_0000000c,width);
  pAVar1 = (pWVar4->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar6 = (int)pAVar1->size;
  }
  else {
    iVar6 = (int)((ulong)pAVar1 >> 3);
  }
  LVar3 = nents((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
  if (LVar3 * in_R8D == iVar6) {
    bVar2 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
    if (bVar2) {
      owned((Mesh *)&stack0xffffffffffffffc0,ent_dim);
      Write<signed_char>::Write(&local_60,(Write<signed_char> *)&stack0xffffffffffffffc0);
      collect_marked((Omega_h *)&local_50,(Read<signed_char> *)&local_60);
      Write<signed_char>::~Write(&local_60);
      Write<int>::Write(&local_80,&local_50);
      Write<signed_char>::Write(&local_90,pWVar4);
      unmap<signed_char>((Omega_h *)&local_70,(LOs *)&local_80,(Read<signed_char> *)&local_90,in_R8D
                        );
      Read<signed_char>::Read((Read<signed_char> *)this,&local_70);
      Write<signed_char>::~Write(&local_70);
      Write<signed_char>::~Write(&local_90);
      Write<int>::~Write(&local_80);
      Write<int>::~Write(&local_50);
      Write<signed_char>::~Write((Write<signed_char> *)&stack0xffffffffffffffc0);
      pvVar5 = extraout_RDX;
    }
    else {
      Write<signed_char>::Write((Write<signed_char> *)this,pWVar4);
      pvVar5 = extraout_RDX_00;
    }
    RVar7.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == width * nents(ent_dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
       ,0x267);
}

Assistant:

Read<T> Mesh::owned_array(Int ent_dim, Read<T> a, Int width) {
  OMEGA_H_CHECK(a.size() == width * nents(ent_dim));
  if (!could_be_shared(ent_dim)) return a;
  auto o = owned(ent_dim);
  auto o2e = collect_marked(o);
  return unmap(o2e, a, width);
}